

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

bool __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator *this,iterator other)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  uint __line;
  bool bVar2;
  char *__assertion;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) {
    __assertion = "this->Tree";
    __line = 0x6e;
  }
  else {
    if ((long)(pcVar1->UpPositions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pcVar1->UpPositions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 ==
        (long)(pcVar1->Data).
              super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pcVar1->Data).
              super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_start >> 6) {
      bVar2 = operator==(this,other);
      return !bVar2;
    }
    __assertion = "this->Tree->UpPositions.size() == this->Tree->Data.size()";
    __line = 0x6f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,__line,
                "bool cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::operator!=(iterator) const [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

bool operator!=(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      return !(*this == other);
    }